

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3-prov.c
# Opt level: O0

void * blake3_dupctx(void *vctx)

{
  blake3_ctx *dst;
  blake3_ctx *src;
  void *vctx_local;
  
  vctx_local = blake3_newctx((void *)0x0);
  if ((undefined8 *)vctx_local == (undefined8 *)0x0) {
    vctx_local = (void *)0x0;
  }
  else {
    *(undefined8 *)vctx_local = *vctx;
    *(undefined8 *)((long)vctx_local + 8) = *(undefined8 *)((long)vctx + 8);
  }
  return vctx_local;
}

Assistant:

static void *blake3_dupctx(void *vctx)
{
	struct blake3_ctx *src = vctx;
	struct blake3_ctx *dst = NULL;

	dst = blake3_newctx(NULL);

	if (dst == NULL) {
		return NULL;
	}

	dst->prov = src->prov;
	dst->out_len = src->out_len;

	return dst;
}